

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_avx2_256_16.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_table_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m256i alVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  short sVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [24];
  undefined1 auVar22 [24];
  __m256i alVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  undefined4 uVar29;
  int iVar30;
  __m256i *palVar31;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar32 [64];
  int in_stack_00000008;
  __m256i vH_1;
  int32_t temp;
  int32_t column_len;
  int16_t *t;
  __m256i vCompare;
  __m256i vFt;
  __m256i vW;
  __m256i *pvW;
  __m256i vHp;
  __m256i vH;
  __m256i vF;
  __m256i vHt;
  __m256i vE;
  __m256i vGapper;
  int64_t tmp_1;
  int64_t tmp;
  __m256i_16_t e;
  __m256i_16_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m256i vSegLenXgap;
  __m256i vNegInfFront;
  __m256i vPosMask;
  __m256i vMaxH;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int16_t score;
  __m256i vZero;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvGapper;
  __m256i *pvH;
  __m256i *pvHt;
  int16_t *boundary;
  __m256i *pvE;
  __m256i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  long in_stack_ffffffffffffeee8;
  int32_t in_stack_ffffffffffffeef0;
  int in_stack_ffffffffffffeef4;
  long in_stack_ffffffffffffeef8;
  long in_stack_ffffffffffffef00;
  int in_stack_ffffffffffffef08;
  ushort uVar33;
  int *in_stack_ffffffffffffef20;
  __m256i local_10e0;
  undefined1 auStack_10d0 [16];
  __m256i *local_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  long lStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  __m256i local_1020;
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  longlong local_fa0;
  longlong lStack_f98;
  longlong lStack_f90;
  longlong lStack_f88;
  undefined1 local_f80 [32];
  longlong local_f40;
  longlong lStack_f38;
  longlong lStack_f30;
  longlong lStack_f28;
  longlong local_f20;
  longlong lStack_f18;
  longlong lStack_f10;
  longlong lStack_f08;
  int local_ef0;
  int local_eec;
  parasail_result_t *local_ee8;
  undefined1 local_ee0 [32];
  ulong local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined1 local_ea0 [32];
  undefined1 local_e80 [24];
  undefined8 uStack_e68;
  undefined1 local_e60 [32];
  undefined1 local_e40 [32];
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  ushort local_dc2;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  ushort local_d84;
  ushort local_d82;
  undefined1 local_d80 [16];
  undefined1 auStack_d70 [16];
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  __m256i *local_d38;
  __m256i *local_d30;
  __m256i *local_d28;
  int16_t *local_d20;
  __m256i *local_d18;
  long local_d10;
  uint local_d08;
  int local_d04;
  int local_d00;
  int local_cfc;
  long local_cf8;
  int local_cf0;
  int local_cec;
  int local_ce8;
  int local_ce4;
  int local_ce0;
  int local_cdc;
  int local_cd8;
  uint local_cd4;
  uint local_cd0;
  int local_ccc;
  long local_cc8;
  parasail_result_t *local_cb8;
  ushort local_cb0;
  ushort local_cae;
  ushort local_cac;
  ushort local_caa;
  ushort local_ca8;
  ushort local_ca6;
  ushort local_ca4;
  ushort local_ca2;
  undefined1 local_ca0 [32];
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined1 local_c40 [16];
  undefined1 auStack_c30 [16];
  ushort local_c20;
  ushort local_c1e;
  ushort local_c1c;
  ushort local_c1a;
  ushort local_c18;
  ushort local_c16;
  ushort local_c14;
  ushort local_c12;
  ushort local_c10;
  ushort local_c0e;
  ushort local_c0c;
  ushort local_c0a;
  ushort local_c08;
  ushort local_c06;
  ushort local_c04;
  ushort local_c02;
  undefined1 local_c00 [32];
  ushort local_be0;
  ushort local_bde;
  ushort local_bdc;
  ushort local_bda;
  ushort local_bd8;
  ushort local_bd6;
  ushort local_bd4;
  ushort local_bd2;
  ushort local_bd0;
  ushort local_bce;
  ushort local_bcc;
  ushort local_bca;
  ushort local_bc8;
  ushort local_bc6;
  ushort local_bc4;
  ushort local_bc2;
  undefined1 local_bc0 [16];
  undefined1 auStack_bb0 [16];
  ushort local_ba0;
  ushort local_b9e;
  ushort local_b9c;
  ushort local_b9a;
  ushort local_b98;
  ushort local_b96;
  ushort local_b94;
  ushort local_b92;
  ushort local_b90;
  ushort local_b8e;
  ushort local_b8c;
  ushort local_b8a;
  ushort local_b88;
  ushort local_b86;
  ushort local_b84;
  ushort local_b82;
  undefined1 local_b80 [16];
  undefined1 auStack_b70 [16];
  ushort local_b60;
  ushort local_b5e;
  ushort local_b5c;
  ushort local_b5a;
  ushort local_b58;
  ushort local_b56;
  ushort local_b54;
  ushort local_b52;
  ushort local_b50;
  ushort local_b4e;
  ushort local_b4c;
  ushort local_b4a;
  ushort local_b48;
  ushort local_b46;
  ushort local_b44;
  ushort local_b42;
  undefined1 local_b40 [16];
  undefined1 auStack_b30 [16];
  ushort local_b20;
  ushort local_b1e;
  ushort local_b1c;
  ushort local_b1a;
  ushort local_b18;
  ushort local_b16;
  ushort local_b14;
  ushort local_b12;
  ushort local_b10;
  ushort local_b0e;
  ushort local_b0c;
  ushort local_b0a;
  ushort local_b08;
  ushort local_b06;
  ushort local_b04;
  ushort local_b02;
  undefined1 local_b00 [16];
  undefined1 auStack_af0 [16];
  ushort local_ae0;
  ushort local_ade;
  ushort local_adc;
  ushort local_ada;
  ushort local_ad8;
  ushort local_ad6;
  ushort local_ad4;
  ushort local_ad2;
  ushort local_ad0;
  ushort local_ace;
  ushort local_acc;
  ushort local_aca;
  ushort local_ac8;
  ushort local_ac6;
  ushort local_ac4;
  ushort local_ac2;
  undefined1 local_ac0 [16];
  undefined1 auStack_ab0 [16];
  ushort local_aa0;
  ushort local_a9e;
  ushort local_a9c;
  ushort local_a9a;
  ushort local_a98;
  ushort local_a96;
  ushort local_a94;
  ushort local_a92;
  ushort local_a90;
  ushort local_a8e;
  ushort local_a8c;
  ushort local_a8a;
  ushort local_a88;
  ushort local_a86;
  ushort local_a84;
  ushort local_a82;
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  ushort local_a60;
  ushort local_a5e;
  ushort local_a5c;
  ushort local_a5a;
  ushort local_a58;
  ushort local_a56;
  ushort local_a54;
  ushort local_a52;
  ushort local_a50;
  ushort local_a4e;
  ushort local_a4c;
  ushort local_a4a;
  ushort local_a48;
  ushort local_a46;
  ushort local_a44;
  ushort local_a42;
  undefined1 local_a40 [16];
  undefined1 auStack_a30 [16];
  undefined2 local_a20;
  undefined2 local_a1e;
  undefined2 local_a1c;
  undefined2 local_a1a;
  undefined2 local_a18;
  undefined2 local_a16;
  undefined2 local_a14;
  undefined2 local_a12;
  undefined2 local_a10;
  undefined2 local_a0e;
  undefined2 local_a0c;
  undefined2 local_a0a;
  undefined2 local_a08;
  undefined2 local_a06;
  undefined2 local_a04;
  undefined2 local_a02;
  ulong local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  longlong local_980;
  longlong lStack_978;
  longlong lStack_970;
  longlong lStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  longlong local_940;
  longlong lStack_938;
  longlong lStack_930;
  longlong lStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  longlong local_8e0;
  longlong lStack_8d8;
  longlong lStack_8d0;
  longlong lStack_8c8;
  undefined1 local_8c0 [32];
  ulong local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  longlong local_880;
  longlong lStack_878;
  longlong lStack_870;
  longlong lStack_868;
  __m256i *local_848;
  longlong local_840;
  longlong lStack_838;
  longlong lStack_830;
  longlong lStack_828;
  __m256i *local_808;
  longlong local_800;
  longlong lStack_7f8;
  longlong lStack_7f0;
  longlong lStack_7e8;
  __m256i *local_7c8;
  longlong local_7c0;
  longlong lStack_7b8;
  longlong lStack_7b0;
  longlong lStack_7a8;
  __m256i *local_788;
  __m256i *local_748;
  __m256i *local_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [16];
  undefined1 auStack_6b0 [16];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  longlong lStack_648;
  undefined1 local_640 [16];
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  longlong lStack_608;
  longlong local_600;
  longlong lStack_5f8;
  longlong lStack_5f0;
  longlong lStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [16];
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  longlong local_5a0;
  longlong lStack_598;
  longlong lStack_590;
  longlong lStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  longlong local_500;
  longlong lStack_4f8;
  longlong lStack_4f0;
  longlong lStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  __m256i *local_478;
  __m256i *local_470;
  __m256i *local_468;
  undefined1 (*local_460) [32];
  __m256i *local_458;
  __m256i *local_450;
  __m256i *local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  longlong lStack_408;
  longlong local_400;
  longlong lStack_3f8;
  longlong lStack_3f0;
  longlong lStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  longlong lStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  longlong local_280;
  longlong lStack_278;
  longlong lStack_270;
  longlong lStack_268;
  longlong local_260;
  longlong lStack_258;
  longlong lStack_250;
  longlong lStack_248;
  undefined1 local_240 [32];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  longlong lStack_c8;
  undefined1 local_c0 [32];
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  long lStack_88;
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  local_cdc = 0;
  local_ce0 = 0;
  local_ce4 = 0;
  local_ce8 = 0;
  local_cec = 0;
  local_cf0 = 0;
  local_cf8 = 0;
  local_cfc = 0;
  local_d00 = 0;
  local_d04 = 0;
  local_d08 = 0;
  local_d10 = 0;
  local_d18 = (__m256i *)0x0;
  local_d20 = (int16_t *)0x0;
  local_d28 = (__m256i *)0x0;
  local_d30 = (__m256i *)0x0;
  local_d38 = (__m256i *)0x0;
  local_d82 = 0;
  local_d84 = 0;
  local_dc2 = 0;
  local_ee8 = (parasail_result_t *)0x0;
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_avx2_256_16","profile")
    ;
    local_cb8 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x30) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_avx2_256_16",
            "profile->profile16.score");
    local_cb8 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_avx2_256_16",
            "profile->matrix");
    local_cb8 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_scan_profile_avx2_256_16",
            "profile->s1Len");
    local_cb8 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_avx2_256_16","s2");
    local_cb8 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_scan_profile_avx2_256_16",
            "s2Len");
    local_cb8 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_scan_profile_avx2_256_16",
            "open");
    local_cb8 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_scan_profile_avx2_256_16","gap"
           );
    local_cb8 = (parasail_result_t *)0x0;
  }
  else {
    local_cdc = 0;
    local_ce0 = 0;
    local_ce4 = 0;
    local_cf0 = *(int *)(in_RDI + 8);
    local_ce8 = local_cf0 + -1;
    local_cec = in_EDX + -1;
    local_cf8 = *(long *)(in_RDI + 0x10);
    local_cfc = 0x10;
    local_d00 = (local_cf0 + 0xf) / 0x10;
    local_d04 = (local_cf0 + -1) % local_d00;
    local_d08 = ~((local_cf0 + -1) / local_d00) + 0x10;
    local_d10 = *(long *)(in_RDI + 0x30);
    local_cd0._0_2_ = (ushort)in_ECX;
    local_ca2 = (ushort)local_cd0;
    local_c02 = (ushort)local_cd0;
    local_c04 = (ushort)local_cd0;
    local_c06 = (ushort)local_cd0;
    local_c08 = (ushort)local_cd0;
    local_c0a = (ushort)local_cd0;
    local_c0c = (ushort)local_cd0;
    local_c0e = (ushort)local_cd0;
    local_c10 = (ushort)local_cd0;
    local_c12 = (ushort)local_cd0;
    local_c14 = (ushort)local_cd0;
    local_c16 = (ushort)local_cd0;
    local_c18 = (ushort)local_cd0;
    local_c1a = (ushort)local_cd0;
    local_c1c = (ushort)local_cd0;
    local_c1e = (ushort)local_cd0;
    local_c20 = (ushort)local_cd0;
    auVar1 = vpinsrw_avx(ZEXT216((ushort)local_cd0),in_ECX & 0xffff,1);
    auVar1 = vpinsrw_avx(auVar1,in_ECX & 0xffff,2);
    auVar1 = vpinsrw_avx(auVar1,in_ECX & 0xffff,3);
    auVar1 = vpinsrw_avx(auVar1,in_ECX & 0xffff,4);
    auVar1 = vpinsrw_avx(auVar1,in_ECX & 0xffff,5);
    auVar1 = vpinsrw_avx(auVar1,in_ECX & 0xffff,6);
    local_c40 = vpinsrw_avx(auVar1,in_ECX & 0xffff,7);
    auVar1 = vpinsrw_avx(ZEXT216((ushort)local_cd0),in_ECX & 0xffff,1);
    auVar1 = vpinsrw_avx(auVar1,in_ECX & 0xffff,2);
    auVar1 = vpinsrw_avx(auVar1,in_ECX & 0xffff,3);
    auVar1 = vpinsrw_avx(auVar1,in_ECX & 0xffff,4);
    auVar1 = vpinsrw_avx(auVar1,in_ECX & 0xffff,5);
    auVar1 = vpinsrw_avx(auVar1,in_ECX & 0xffff,6);
    auStack_c30 = vpinsrw_avx(auVar1,in_ECX & 0xffff,7);
    local_d60 = local_c40._0_8_;
    uStack_d58 = local_c40._8_8_;
    uStack_d50 = auStack_c30._0_8_;
    uStack_d48 = auStack_c30._8_8_;
    local_cd4._0_2_ = (ushort)in_R8D;
    local_ca4 = (ushort)local_cd4;
    local_bc2 = (ushort)local_cd4;
    local_bc4 = (ushort)local_cd4;
    local_bc6 = (ushort)local_cd4;
    local_bc8 = (ushort)local_cd4;
    local_bca = (ushort)local_cd4;
    local_bcc = (ushort)local_cd4;
    local_bce = (ushort)local_cd4;
    local_bd0 = (ushort)local_cd4;
    local_bd2 = (ushort)local_cd4;
    local_bd4 = (ushort)local_cd4;
    local_bd6 = (ushort)local_cd4;
    local_bd8 = (ushort)local_cd4;
    local_bda = (ushort)local_cd4;
    local_bdc = (ushort)local_cd4;
    local_bde = (ushort)local_cd4;
    local_be0 = (ushort)local_cd4;
    auVar1 = vpinsrw_avx(ZEXT216((ushort)local_cd4),in_R8D & 0xffff,1);
    auVar1 = vpinsrw_avx(auVar1,in_R8D & 0xffff,2);
    auVar1 = vpinsrw_avx(auVar1,in_R8D & 0xffff,3);
    auVar1 = vpinsrw_avx(auVar1,in_R8D & 0xffff,4);
    auVar1 = vpinsrw_avx(auVar1,in_R8D & 0xffff,5);
    auVar1 = vpinsrw_avx(auVar1,in_R8D & 0xffff,6);
    auVar1 = vpinsrw_avx(auVar1,in_R8D & 0xffff,7);
    auVar2 = vpinsrw_avx(ZEXT216((ushort)local_cd4),in_R8D & 0xffff,1);
    auVar2 = vpinsrw_avx(auVar2,in_R8D & 0xffff,2);
    auVar2 = vpinsrw_avx(auVar2,in_R8D & 0xffff,3);
    auVar2 = vpinsrw_avx(auVar2,in_R8D & 0xffff,4);
    auVar2 = vpinsrw_avx(auVar2,in_R8D & 0xffff,5);
    auVar2 = vpinsrw_avx(auVar2,in_R8D & 0xffff,6);
    auVar2 = vpinsrw_avx(auVar2,in_R8D & 0xffff,7);
    local_c00._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    local_c00._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    if (*(int *)(local_cf8 + 0x20) <= (int)-in_ECX) {
      local_cd0._0_2_ = -(short)*(undefined4 *)(local_cf8 + 0x20);
    }
    uVar24 = (ushort)local_cd0 + 0x8001;
    uVar25 = ((ushort)*(undefined4 *)(local_cf8 + 0x1c) ^ 0x7fff) - 1;
    local_ca0._8_8_ = SUB328(ZEXT832(0),4);
    local_dc0 = 0;
    uStack_db8 = local_ca0._8_8_;
    uStack_db0 = 0;
    uStack_da8 = 0;
    auVar1 = vpinsrw_avx(ZEXT216(uVar24),(uint)uVar24,1);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar24,2);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar24,3);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar24,4);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar24,5);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar24,6);
    local_bc0 = vpinsrw_avx(auVar1,(uint)uVar24,7);
    auVar1 = vpinsrw_avx(ZEXT216(uVar24),(uint)uVar24,1);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar24,2);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar24,3);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar24,4);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar24,5);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar24,6);
    auStack_bb0 = vpinsrw_avx(auVar1,(uint)uVar24,7);
    local_e00 = local_bc0._0_8_;
    uStack_df8 = local_bc0._8_8_;
    uStack_df0 = auStack_bb0._0_8_;
    uStack_de8 = auStack_bb0._8_8_;
    auVar1 = vpinsrw_avx(ZEXT216(uVar25),(uint)uVar25,1);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar25,2);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar25,3);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar25,4);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar25,5);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar25,6);
    local_b80 = vpinsrw_avx(auVar1,(uint)uVar25,7);
    auVar1 = vpinsrw_avx(ZEXT216(uVar25),(uint)uVar25,1);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar25,2);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar25,3);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar25,4);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar25,5);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar25,6);
    auStack_b70 = vpinsrw_avx(auVar1,(uint)uVar25,7);
    local_e20 = local_b80._0_8_;
    uStack_e18 = local_b80._8_8_;
    uStack_e10 = auStack_b70._0_8_;
    uStack_e08 = auStack_b70._8_8_;
    local_e40._16_8_ = auStack_b70._0_8_;
    local_e40._0_16_ = local_b80;
    local_e40._24_8_ = auStack_b70._8_8_;
    local_e60._16_8_ = auStack_bb0._0_8_;
    local_e60._0_16_ = local_bc0;
    local_e60._24_8_ = auStack_bb0._8_8_;
    local_e80._16_8_ = auStack_bb0._0_8_;
    local_e80._0_16_ = local_bc0;
    uStack_e68 = auStack_bb0._8_8_;
    local_caa = (ushort)local_d08;
    local_b02 = (ushort)local_d08;
    local_b04 = (ushort)local_d08;
    local_b06 = (ushort)local_d08;
    local_b08 = (ushort)local_d08;
    local_b0a = (ushort)local_d08;
    local_b0c = (ushort)local_d08;
    local_b0e = (ushort)local_d08;
    local_b10 = (ushort)local_d08;
    local_b12 = (ushort)local_d08;
    local_b14 = (ushort)local_d08;
    local_b16 = (ushort)local_d08;
    local_b18 = (ushort)local_d08;
    local_b1a = (ushort)local_d08;
    local_b1c = (ushort)local_d08;
    local_b1e = (ushort)local_d08;
    local_b20 = (ushort)local_d08;
    auVar1 = vpinsrw_avx(ZEXT216((ushort)local_d08),local_d08 & 0xffff,1);
    auVar1 = vpinsrw_avx(auVar1,local_d08 & 0xffff,2);
    auVar1 = vpinsrw_avx(auVar1,local_d08 & 0xffff,3);
    auVar1 = vpinsrw_avx(auVar1,local_d08 & 0xffff,4);
    auVar1 = vpinsrw_avx(auVar1,local_d08 & 0xffff,5);
    auVar1 = vpinsrw_avx(auVar1,local_d08 & 0xffff,6);
    local_b40 = vpinsrw_avx(auVar1,local_d08 & 0xffff,7);
    auVar1 = vpinsrw_avx(ZEXT216((ushort)local_d08),local_d08 & 0xffff,1);
    auVar1 = vpinsrw_avx(auVar1,local_d08 & 0xffff,2);
    auVar1 = vpinsrw_avx(auVar1,local_d08 & 0xffff,3);
    auVar1 = vpinsrw_avx(auVar1,local_d08 & 0xffff,4);
    auVar1 = vpinsrw_avx(auVar1,local_d08 & 0xffff,5);
    auVar1 = vpinsrw_avx(auVar1,local_d08 & 0xffff,6);
    auStack_b30 = vpinsrw_avx(auVar1,local_d08 & 0xffff,7);
    local_a02 = 0;
    local_a04 = 1;
    local_a06 = 2;
    local_a08 = 3;
    local_a0a = 4;
    local_a0c = 5;
    local_a0e = 6;
    local_a10 = 7;
    local_a12 = 8;
    local_a14 = 9;
    local_a16 = 10;
    local_a18 = 0xb;
    local_a1a = 0xc;
    local_a1c = 0xd;
    local_a1e = 0xe;
    local_a20 = 0xf;
    auVar1 = vpinsrw_avx(ZEXT216(0xf),0xe,1);
    auVar1 = vpinsrw_avx(auVar1,0xd,2);
    auVar1 = vpinsrw_avx(auVar1,0xc,3);
    auVar1 = vpinsrw_avx(auVar1,0xb,4);
    auVar1 = vpinsrw_avx(auVar1,10,5);
    auVar1 = vpinsrw_avx(auVar1,9,6);
    local_a40 = vpinsrw_avx(auVar1,8,7);
    auVar1 = vpinsrw_avx(ZEXT216(7),6,1);
    auVar1 = vpinsrw_avx(auVar1,5,2);
    auVar1 = vpinsrw_avx(auVar1,4,3);
    auVar1 = vpinsrw_avx(auVar1,3,4);
    auVar1 = vpinsrw_avx(auVar1,2,5);
    auVar1 = vpinsrw_avx(auVar1,1,6);
    auStack_a30 = vpinsrw_avx(auVar1,0,7);
    local_c60 = local_b40._0_8_;
    uStack_c58 = local_b40._8_8_;
    uStack_c50 = auStack_b30._0_8_;
    uStack_c48 = auStack_b30._8_8_;
    local_c80 = local_a40._0_8_;
    uStack_c78 = local_a40._8_8_;
    uStack_c70 = auStack_a30._0_8_;
    uStack_c68 = auStack_a30._8_8_;
    auVar6._16_8_ = auStack_b30._0_8_;
    auVar6._0_16_ = local_b40;
    auVar6._24_8_ = auStack_b30._8_8_;
    auVar5._16_8_ = auStack_a30._0_8_;
    auVar5._0_16_ = local_a40;
    auVar5._24_8_ = auStack_a30._8_8_;
    local_ea0 = vpcmpeqw_avx2(auVar6,auVar5);
    uStack_eb8 = local_ca0._8_8_;
    uStack_eb0 = 0;
    uStack_ea8 = 0;
    local_ec0 = (ulong)uVar24;
    sVar8 = (short)local_d00;
    uVar26 = -sVar8 * (ushort)local_cd4;
    auVar1 = vpinsrw_avx(ZEXT216(uVar26),(uint)uVar26,1);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar26,2);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar26,3);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar26,4);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar26,5);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar26,6);
    local_b00 = vpinsrw_avx(auVar1,(uint)uVar26,7);
    auVar1 = vpinsrw_avx(ZEXT216(uVar26),(uint)uVar26,1);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar26,2);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar26,3);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar26,4);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar26,5);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar26,6);
    auStack_af0 = vpinsrw_avx(auVar1,(uint)uVar26,7);
    auVar9._16_16_ = auStack_af0;
    auVar9._0_16_ = local_b00;
    uVar27 = -sVar8 * (ushort)local_cd4;
    auVar1 = vpinsrw_avx(ZEXT216(uVar27),(uint)uVar27,1);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar27,2);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar27,3);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar27,4);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar27,5);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar27,6);
    local_ac0 = vpinsrw_avx(auVar1,(uint)uVar27,7);
    auVar1 = vpinsrw_avx(ZEXT216(uVar27),(uint)uVar27,1);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar27,2);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar27,3);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar27,4);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar27,5);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar27,6);
    auStack_ab0 = vpinsrw_avx(auVar1,(uint)uVar27,7);
    auVar10._16_16_ = auStack_ab0;
    auVar10._0_16_ = local_ac0;
    uVar28 = -sVar8 * (ushort)local_cd4;
    auVar1 = vpinsrw_avx(ZEXT216(uVar28),(uint)uVar28,1);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar28,2);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar28,3);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar28,4);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar28,5);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar28,6);
    local_a80 = vpinsrw_avx(auVar1,(uint)uVar28,7);
    auVar1 = vpinsrw_avx(ZEXT216(uVar28),(uint)uVar28,1);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar28,2);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar28,3);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar28,4);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar28,5);
    auVar1 = vpinsrw_avx(auVar1,(uint)uVar28,6);
    local_a70 = vpinsrw_avx(auVar1,(uint)uVar28,7);
    auVar5 = vperm2i128_avx2(ZEXT1632(local_a80),auVar10,0x28);
    local_8c0 = vpalignr_avx2(auVar9,auVar5,0xe);
    local_8a0 = local_ec0;
    uStack_898 = local_ca0._8_8_;
    uStack_890 = 0;
    uStack_888 = 0;
    local_ee0 = vpaddsw_avx2(ZEXT1632(CONCAT88(local_ca0._8_8_,local_ec0)),local_8c0);
    uVar33 = (ushort)local_d08;
    local_dc2 = uVar24;
    local_d84 = uVar25;
    local_d82 = uVar24;
    local_cd8 = in_R9D;
    local_cd4 = in_R8D;
    local_cd0 = in_ECX;
    local_ccc = in_EDX;
    local_cc8 = in_RSI;
    local_cb0 = uVar28;
    local_cae = uVar27;
    local_cac = uVar26;
    local_ca8 = uVar25;
    local_ca6 = uVar24;
    local_ca0 = ZEXT832(0) << 0x20;
    local_ba0 = uVar24;
    local_b9e = uVar24;
    local_b9c = uVar24;
    local_b9a = uVar24;
    local_b98 = uVar24;
    local_b96 = uVar24;
    local_b94 = uVar24;
    local_b92 = uVar24;
    local_b90 = uVar24;
    local_b8e = uVar24;
    local_b8c = uVar24;
    local_b8a = uVar24;
    local_b88 = uVar24;
    local_b86 = uVar24;
    local_b84 = uVar24;
    local_b82 = uVar24;
    local_b60 = uVar25;
    local_b5e = uVar25;
    local_b5c = uVar25;
    local_b5a = uVar25;
    local_b58 = uVar25;
    local_b56 = uVar25;
    local_b54 = uVar25;
    local_b52 = uVar25;
    local_b50 = uVar25;
    local_b4e = uVar25;
    local_b4c = uVar25;
    local_b4a = uVar25;
    local_b48 = uVar25;
    local_b46 = uVar25;
    local_b44 = uVar25;
    local_b42 = uVar25;
    local_ae0 = uVar26;
    local_ade = uVar26;
    local_adc = uVar26;
    local_ada = uVar26;
    local_ad8 = uVar26;
    local_ad6 = uVar26;
    local_ad4 = uVar26;
    local_ad2 = uVar26;
    local_ad0 = uVar26;
    local_ace = uVar26;
    local_acc = uVar26;
    local_aca = uVar26;
    local_ac8 = uVar26;
    local_ac6 = uVar26;
    local_ac4 = uVar26;
    local_ac2 = uVar26;
    local_aa0 = uVar27;
    local_a9e = uVar27;
    local_a9c = uVar27;
    local_a9a = uVar27;
    local_a98 = uVar27;
    local_a96 = uVar27;
    local_a94 = uVar27;
    local_a92 = uVar27;
    local_a90 = uVar27;
    local_a8e = uVar27;
    local_a8c = uVar27;
    local_a8a = uVar27;
    local_a88 = uVar27;
    local_a86 = uVar27;
    local_a84 = uVar27;
    local_a82 = uVar27;
    local_a60 = uVar28;
    local_a5e = uVar28;
    local_a5c = uVar28;
    local_a5a = uVar28;
    local_a58 = uVar28;
    local_a56 = uVar28;
    local_a54 = uVar28;
    local_a52 = uVar28;
    local_a50 = uVar28;
    local_a4e = uVar28;
    local_a4c = uVar28;
    local_a4a = uVar28;
    local_a48 = uVar28;
    local_a46 = uVar28;
    local_a44 = uVar28;
    local_a42 = uVar28;
    local_d80 = local_c00._0_16_;
    auStack_d70 = local_c00._16_16_;
    local_ee8 = parasail_result_new_table1(local_d00 * 0x10,in_EDX);
    if (local_ee8 == (parasail_result_t *)0x0) {
      local_cb8 = (parasail_result_t *)0x0;
    }
    else {
      local_ee8->flag = local_ee8->flag | 0x10200402;
      uVar7 = 0;
      if (local_cd8 != 0) {
        uVar7 = 8;
      }
      local_ee8->flag = uVar7 | local_ee8->flag;
      uVar7 = 0;
      if (in_stack_00000008 != 0) {
        uVar7 = 0x10;
      }
      local_ee8->flag = uVar7 | local_ee8->flag;
      uVar7 = 0;
      if (s1_end != 0) {
        uVar7 = 0x4000;
      }
      local_ee8->flag = uVar7 | local_ee8->flag;
      uVar7 = 0;
      if (s2_beg != 0) {
        uVar7 = 0x8000;
      }
      local_ee8->flag = uVar7 | local_ee8->flag;
      local_ee8->flag = local_ee8->flag | 0x20000;
      local_d18 = parasail_memalign___m256i(0x20,(long)local_d00);
      local_d20 = parasail_memalign_int16_t(0x20,(long)(local_ccc + 1));
      local_d28 = parasail_memalign___m256i(0x20,(long)local_d00);
      local_d30 = parasail_memalign___m256i(0x20,(long)local_d00);
      local_d38 = parasail_memalign___m256i(0x20,(long)local_d00);
      if (local_d18 == (__m256i *)0x0) {
        local_cb8 = (parasail_result_t *)0x0;
      }
      else if (local_d20 == (int16_t *)0x0) {
        local_cb8 = (parasail_result_t *)0x0;
      }
      else if (local_d28 == (__m256i *)0x0) {
        local_cb8 = (parasail_result_t *)0x0;
      }
      else if (local_d30 == (__m256i *)0x0) {
        local_cb8 = (parasail_result_t *)0x0;
      }
      else if (local_d38 == (__m256i *)0x0) {
        local_cb8 = (parasail_result_t *)0x0;
      }
      else {
        local_eec = 0;
        local_cdc = 0;
        while( true ) {
          if (local_d00 <= local_cdc) break;
          for (local_ef0 = 0; local_ef0 < local_cfc; local_ef0 = local_ef0 + 1) {
            if (local_cd8 == 0) {
              in_stack_ffffffffffffef08 =
                   -(local_cd4 * (local_ef0 * local_d00 + local_cdc)) - local_cd0;
            }
            else {
              in_stack_ffffffffffffef08 = 0;
            }
            in_stack_ffffffffffffeef8 = (long)in_stack_ffffffffffffef08;
            in_stack_ffffffffffffef00 = in_stack_ffffffffffffeef8;
            if (in_stack_ffffffffffffeef8 < -0x8000) {
              in_stack_ffffffffffffef00 = -0x8000;
            }
            *(short *)((long)&local_f20 + (long)local_ef0 * 2) = (short)in_stack_ffffffffffffef00;
            in_stack_ffffffffffffeef8 = in_stack_ffffffffffffeef8 - (int)local_cd0;
            if (in_stack_ffffffffffffeef8 < -0x8000) {
              in_stack_ffffffffffffeef8 = -0x8000;
            }
            *(short *)((long)&local_f40 + (long)local_ef0 * 2) = (short)in_stack_ffffffffffffeef8;
          }
          local_708 = local_d30 + local_eec;
          (*local_708)[0] = local_f20;
          (*local_708)[1] = lStack_f18;
          (*local_708)[2] = lStack_f10;
          (*local_708)[3] = lStack_f08;
          local_748 = local_d18 + local_eec;
          (*local_748)[0] = local_f40;
          (*local_748)[1] = lStack_f38;
          (*local_748)[2] = lStack_f30;
          (*local_748)[3] = lStack_f28;
          local_eec = local_eec + 1;
          local_cdc = local_cdc + 1;
        }
        *local_d20 = 0;
        for (local_cdc = 1; local_cdc <= local_ccc; local_cdc = local_cdc + 1) {
          if (s1_end == 0) {
            in_stack_ffffffffffffeef4 = -(local_cd4 * (local_cdc + -1)) - local_cd0;
          }
          else {
            in_stack_ffffffffffffeef4 = 0;
          }
          in_stack_ffffffffffffeee8 = (long)in_stack_ffffffffffffeef4;
          if (in_stack_ffffffffffffeee8 < -0x8000) {
            in_stack_ffffffffffffeee8 = -0x8000;
          }
          local_d20[local_cdc] = (int16_t)in_stack_ffffffffffffeee8;
        }
        local_560 = local_dc0;
        uStack_558 = uStack_db8;
        uStack_550 = uStack_db0;
        uStack_548 = uStack_da8;
        local_580 = local_d60;
        uStack_578 = uStack_d58;
        uStack_570 = uStack_d50;
        uStack_568 = uStack_d48;
        auVar18._8_8_ = uStack_db8;
        auVar18._0_8_ = local_dc0;
        auVar18._16_8_ = uStack_db0;
        auVar18._24_8_ = uStack_da8;
        auVar4._8_8_ = uStack_d58;
        auVar4._0_8_ = local_d60;
        auVar4._16_8_ = uStack_d50;
        auVar4._24_8_ = uStack_d48;
        local_f80 = vpsubsw_avx2(auVar18,auVar4);
        local_cdc = local_d00;
        while (local_cdc = local_cdc + -1, -1 < local_cdc) {
          local_788 = local_d38 + local_cdc;
          local_7c0 = local_f80._0_8_;
          lStack_7b8 = local_f80._8_8_;
          lStack_7b0 = local_f80._16_8_;
          lStack_7a8 = local_f80._24_8_;
          (*local_788)[0] = local_f80._0_8_;
          (*local_788)[1] = local_f80._8_8_;
          (*local_788)[2] = local_f80._16_8_;
          (*local_788)[3] = local_f80._24_8_;
          local_5a0 = local_f80._0_8_;
          lStack_598 = local_f80._8_8_;
          lStack_590 = local_f80._16_8_;
          lStack_588 = local_f80._24_8_;
          uStack_5b0 = auStack_d70._0_8_;
          uStack_5a8 = auStack_d70._8_8_;
          auVar17._16_8_ = auStack_d70._0_8_;
          auVar17._0_16_ = local_d80;
          auVar17._24_8_ = auStack_d70._8_8_;
          auVar4 = vpsubsw_avx2(local_f80,auVar17);
          local_4a0 = local_e40._0_8_;
          uStack_498 = local_e40._8_8_;
          uStack_490 = local_e40._16_8_;
          uStack_488 = local_e40._24_8_;
          local_f80._0_8_ = auVar4._0_8_;
          local_4c0 = local_f80._0_8_;
          local_f80._8_8_ = auVar4._8_8_;
          uStack_4b8 = local_f80._8_8_;
          local_f80._16_8_ = auVar4._16_8_;
          uStack_4b0 = local_f80._16_8_;
          local_f80._24_8_ = auVar4._24_8_;
          uStack_4a8 = local_f80._24_8_;
          local_e40 = vpminsw_avx2(local_e40,auVar4);
          local_f80 = auVar4;
          local_5c0 = local_d80;
        }
        local_ce0 = 0;
        while( true ) {
          auVar32 = ZEXT3264(auVar4);
          if (local_ccc <= local_ce0) break;
          local_448 = local_d30 + (local_d00 + -1);
          auVar5 = vperm2i128_avx2(auVar4,(undefined1  [32])*local_448,0x28);
          auVar5 = vpalignr_avx2((undefined1  [32])*local_448,auVar5,0xe);
          auVar1 = vpinsrw_avx(auVar5._0_16_,(uint)(ushort)local_d20[local_ce0],0);
          local_1020 = (__m256i)vblendps_avx(auVar5,ZEXT1632(auVar1),0xf);
          iVar30 = *(int *)(*(long *)(local_cf8 + 0x10) +
                           (ulong)*(byte *)(local_cc8 + local_ce0) * 4);
          local_600 = (*local_d38)[0];
          lStack_5f8 = (*local_d38)[1];
          lStack_5f0 = (*local_d38)[2];
          lStack_5e8 = (*local_d38)[3];
          alVar3 = *local_d38;
          local_5e0 = local_e00;
          uStack_5d8 = uStack_df8;
          uStack_5d0 = uStack_df0;
          uStack_5c8 = uStack_de8;
          auVar16._8_8_ = uStack_df8;
          auVar16._0_8_ = local_e00;
          auVar16._16_8_ = uStack_df0;
          auVar16._24_8_ = uStack_de8;
          local_fc0 = vpsubsw_avx2(auVar16,(undefined1  [32])alVar3);
          local_fe0._8_8_ = uStack_df8;
          local_fe0._0_8_ = local_e00;
          local_fe0._16_8_ = uStack_df0;
          local_fe0._24_8_ = uStack_de8;
          local_cdc = 0;
          while( true ) {
            if (local_d00 <= local_cdc) break;
            local_450 = local_d30 + local_cdc;
            auVar21 = *(undefined1 (*) [24])*local_450;
            lStack_648 = (*local_450)[3];
            alVar23 = *local_450;
            local_458 = local_d18 + local_cdc;
            auVar22 = *(undefined1 (*) [24])*local_458;
            lStack_608 = (*local_458)[3];
            local_460 = (undefined1 (*) [32])
                        (local_d10 + (long)(iVar30 * local_d00) * 0x20 + (long)local_cdc * 0x20);
            local_900 = *(undefined8 *)*local_460;
            uStack_8f8 = *(undefined8 *)(*local_460 + 8);
            uStack_8f0 = *(undefined8 *)(*local_460 + 0x10);
            uStack_8e8 = *(undefined8 *)(*local_460 + 0x18);
            local_fa0 = auVar22._0_8_;
            local_620 = local_fa0;
            lStack_f98 = auVar22._8_8_;
            uStack_618 = lStack_f98;
            lStack_f90 = auVar22._16_8_;
            uStack_610 = lStack_f90;
            uStack_630 = auStack_d70._0_8_;
            uStack_628 = auStack_d70._8_8_;
            auVar15._16_8_ = auStack_d70._0_8_;
            auVar15._0_16_ = local_d80;
            auVar15._24_8_ = auStack_d70._8_8_;
            local_1e0 = vpsubsw_avx2((undefined1  [32])*local_458,auVar15);
            local_1000._0_8_ = auVar21._0_8_;
            local_660 = local_1000._0_8_;
            local_1000._8_8_ = auVar21._8_8_;
            uStack_658 = local_1000._8_8_;
            local_1000._16_8_ = auVar21._16_8_;
            uStack_650 = local_1000._16_8_;
            local_680 = local_d60;
            uStack_678 = uStack_d58;
            uStack_670 = uStack_d50;
            uStack_668 = uStack_d48;
            auVar14._8_8_ = uStack_d58;
            auVar14._0_8_ = local_d60;
            auVar14._16_8_ = uStack_d50;
            auVar14._24_8_ = uStack_d48;
            local_200 = vpsubsw_avx2((undefined1  [32])*local_450,auVar14);
            auVar5 = vpmaxsw_avx2(local_1e0,local_200);
            local_8e0 = local_1020[0];
            lStack_8d8 = local_1020[1];
            lStack_8d0 = local_1020[2];
            lStack_8c8 = local_1020[3];
            alVar3 = (__m256i)vpaddsw_avx2((undefined1  [32])local_1020,*local_460);
            local_220 = local_fe0._0_8_;
            uStack_218 = local_fe0._8_8_;
            uStack_210 = local_fe0._16_8_;
            uStack_208 = local_fe0._24_8_;
            local_920 = local_fc0._0_8_;
            uStack_918 = local_fc0._8_8_;
            uStack_910 = local_fc0._16_8_;
            uStack_908 = local_fc0._24_8_;
            palVar31 = local_d38 + local_cdc;
            local_940 = (*palVar31)[0];
            lStack_938 = (*palVar31)[1];
            lStack_930 = (*palVar31)[2];
            lStack_928 = (*palVar31)[3];
            local_240 = vpaddsw_avx2(local_fc0,(undefined1  [32])*palVar31);
            local_fe0 = vpmaxsw_avx2(local_fe0,local_240);
            local_fa0 = auVar5._0_8_;
            local_260 = local_fa0;
            lStack_f98 = auVar5._8_8_;
            lStack_258 = lStack_f98;
            lStack_f90 = auVar5._16_8_;
            lStack_250 = lStack_f90;
            lStack_f88 = auVar5._24_8_;
            lStack_248 = lStack_f88;
            local_1020[0] = alVar3[0];
            local_280 = local_1020[0];
            local_1020[1] = alVar3[1];
            lStack_278 = local_1020[1];
            local_1020[2] = alVar3[2];
            lStack_270 = local_1020[2];
            local_1020[3] = alVar3[3];
            lStack_268 = local_1020[3];
            local_fc0 = vpmaxsw_avx2(auVar5,(undefined1  [32])alVar3);
            local_7c8 = local_d18 + local_cdc;
            local_800 = local_fa0;
            lStack_7f8 = lStack_f98;
            lStack_7f0 = lStack_f90;
            lStack_7e8 = lStack_f88;
            (*local_7c8)[0] = local_fa0;
            (*local_7c8)[1] = lStack_f98;
            (*local_7c8)[2] = lStack_f90;
            (*local_7c8)[3] = lStack_f88;
            local_808 = local_d28 + local_cdc;
            local_840 = local_fc0._0_8_;
            lStack_838 = local_fc0._8_8_;
            lStack_830 = local_fc0._16_8_;
            lStack_828 = local_fc0._24_8_;
            (*local_808)[0] = local_fc0._0_8_;
            (*local_808)[1] = local_fc0._8_8_;
            (*local_808)[2] = local_fc0._16_8_;
            (*local_808)[3] = local_fc0._24_8_;
            local_cdc = local_cdc + 1;
            local_1020 = alVar23;
            local_640 = local_d80;
          }
          auVar5 = vperm2i128_avx2((undefined1  [32])alVar3,local_fc0,0x28);
          auVar5 = vpalignr_avx2(local_fc0,auVar5,0xe);
          auVar1 = vpinsrw_avx(auVar5._0_16_,(uint)(ushort)local_d20[(long)local_ce0 + 1],0);
          auVar5 = vblendps_avx(auVar5,ZEXT1632(auVar1),0xf);
          local_fc0._0_8_ = auVar5._0_8_;
          local_fc0._8_8_ = auVar5._8_8_;
          local_fc0._16_8_ = auVar5._16_8_;
          local_fc0._24_8_ = auVar5._24_8_;
          local_980 = (*local_d38)[0];
          lStack_978 = (*local_d38)[1];
          lStack_970 = (*local_d38)[2];
          lStack_968 = (*local_d38)[3];
          local_960 = local_fc0._0_8_;
          uStack_958 = local_fc0._8_8_;
          uStack_950 = local_fc0._16_8_;
          uStack_948 = local_fc0._24_8_;
          local_2c0 = vpaddsw_avx2(auVar5,(undefined1  [32])*local_d38);
          local_2a0 = local_fe0._0_8_;
          uStack_298 = local_fe0._8_8_;
          uStack_290 = local_fe0._16_8_;
          uStack_288 = local_fe0._24_8_;
          local_fe0 = vpmaxsw_avx2(local_fe0,local_2c0);
          auVar6 = local_2c0;
          for (local_cdc = 0; local_cdc < local_cfc + -2; local_cdc = local_cdc + 1) {
            auVar6 = vperm2i128_avx2(auVar6,local_fe0,0x28);
            auVar6 = vpalignr_avx2(local_fe0,auVar6,0xe);
            local_1080 = auVar6._0_8_;
            local_9a0 = local_1080;
            uStack_1078 = auVar6._8_8_;
            uStack_998 = uStack_1078;
            uStack_1070 = auVar6._16_8_;
            uStack_990 = uStack_1070;
            uStack_1068 = auVar6._24_8_;
            uStack_988 = uStack_1068;
            local_9c0 = local_ee0._0_8_;
            uStack_9b8 = local_ee0._8_8_;
            uStack_9b0 = local_ee0._16_8_;
            uStack_9a8 = local_ee0._24_8_;
            auVar6 = vpaddsw_avx2(auVar6,local_ee0);
            local_2e0 = local_fe0._0_8_;
            uStack_2d8 = local_fe0._8_8_;
            uStack_2d0 = local_fe0._16_8_;
            uStack_2c8 = local_fe0._24_8_;
            local_1080 = auVar6._0_8_;
            local_300 = local_1080;
            uStack_1078 = auVar6._8_8_;
            uStack_2f8 = uStack_1078;
            uStack_1070 = auVar6._16_8_;
            uStack_2f0 = uStack_1070;
            uStack_1068 = auVar6._24_8_;
            uStack_2e8 = uStack_1068;
            local_fe0 = vpmaxsw_avx2(local_fe0,auVar6);
          }
          auVar6 = vperm2i128_avx2(auVar6,local_fe0,0x28);
          auVar6 = vpalignr_avx2(local_fe0,auVar6,0xe);
          local_fe0._0_8_ = auVar6._0_8_;
          local_fe0._8_8_ = auVar6._8_8_;
          local_fe0._16_8_ = auVar6._16_8_;
          local_fe0._24_8_ = auVar6._24_8_;
          local_9e0 = local_fe0._0_8_;
          uStack_9d8 = local_fe0._8_8_;
          uStack_9d0 = local_fe0._16_8_;
          uStack_9c8 = local_fe0._24_8_;
          local_a00 = local_ec0;
          uStack_9f8 = uStack_eb8;
          uStack_9f0 = uStack_eb0;
          uStack_9e8 = uStack_ea8;
          auVar11._8_8_ = uStack_eb8;
          auVar11._0_8_ = local_ec0;
          auVar11._16_8_ = uStack_eb0;
          auVar11._24_8_ = uStack_ea8;
          local_fe0 = vpaddsw_avx2(auVar6,auVar11);
          local_320 = local_fc0._0_8_;
          uStack_318 = local_fc0._8_8_;
          uStack_310 = local_fc0._16_8_;
          uStack_308 = local_fc0._24_8_;
          local_340 = local_fe0._0_8_;
          uStack_338 = local_fe0._8_8_;
          uStack_330 = local_fe0._16_8_;
          uStack_328 = local_fe0._24_8_;
          local_1000 = vpmaxsw_avx2(auVar5,local_fe0);
          local_cdc = 0;
          while( true ) {
            if (local_d00 <= local_cdc) break;
            local_468 = local_d28 + local_cdc;
            auVar21 = *(undefined1 (*) [24])*local_468;
            lStack_388 = (*local_468)[3];
            local_6a0 = local_fe0._0_8_;
            uStack_698 = local_fe0._8_8_;
            uStack_690 = local_fe0._16_8_;
            uStack_688 = local_fe0._24_8_;
            auVar13._16_8_ = auStack_d70._0_8_;
            auVar13._0_16_ = local_d80;
            auVar13._24_8_ = auStack_d70._8_8_;
            local_360 = vpsubsw_avx2(local_fe0,auVar13);
            local_6e0 = local_1000._0_8_;
            uStack_6d8 = local_1000._8_8_;
            uStack_6d0 = local_1000._16_8_;
            uStack_6c8 = local_1000._24_8_;
            local_700 = local_d60;
            uStack_6f8 = uStack_d58;
            uStack_6f0 = uStack_d50;
            uStack_6e8 = uStack_d48;
            auVar12._8_8_ = uStack_d58;
            auVar12._0_8_ = local_d60;
            auVar12._16_8_ = uStack_d50;
            auVar12._24_8_ = uStack_d48;
            local_380 = vpsubsw_avx2(local_1000,auVar12);
            local_fe0 = vpmaxsw_avx2(local_360,local_380);
            local_fc0._0_8_ = auVar21._0_8_;
            local_fc0._8_8_ = auVar21._8_8_;
            local_fc0._16_8_ = auVar21._16_8_;
            local_3a0 = local_fc0._0_8_;
            uStack_398 = local_fc0._8_8_;
            uStack_390 = local_fc0._16_8_;
            local_3c0 = local_fe0._0_8_;
            uStack_3b8 = local_fe0._8_8_;
            uStack_3b0 = local_fe0._16_8_;
            uStack_3a8 = local_fe0._24_8_;
            local_1000 = vpmaxsw_avx2((undefined1  [32])*local_468,local_fe0);
            local_848 = local_d30 + local_cdc;
            local_880 = local_1000._0_8_;
            lStack_878 = local_1000._8_8_;
            lStack_870 = local_1000._16_8_;
            lStack_868 = local_1000._24_8_;
            (*local_848)[0] = local_1000._0_8_;
            (*local_848)[1] = local_1000._8_8_;
            (*local_848)[2] = local_1000._16_8_;
            (*local_848)[3] = local_1000._24_8_;
            local_4e0 = local_e40._0_8_;
            uStack_4d8 = local_e40._8_8_;
            uStack_4d0 = local_e40._16_8_;
            uStack_4c8 = local_e40._24_8_;
            local_500 = local_1000._0_8_;
            lStack_4f8 = local_1000._8_8_;
            lStack_4f0 = local_1000._16_8_;
            lStack_4e8 = local_1000._24_8_;
            auVar5 = vpminsw_avx2(local_e40,local_1000);
            local_e40._0_8_ = auVar5._0_8_;
            local_e40._8_8_ = auVar5._8_8_;
            local_e40._16_8_ = auVar5._16_8_;
            local_e40._24_8_ = auVar5._24_8_;
            local_520 = local_e40._0_8_;
            uStack_518 = local_e40._8_8_;
            uStack_510 = local_e40._16_8_;
            uStack_508 = local_e40._24_8_;
            local_540 = local_fe0._0_8_;
            uStack_538 = local_fe0._8_8_;
            uStack_530 = local_fe0._16_8_;
            uStack_528 = local_fe0._24_8_;
            local_e40 = vpminsw_avx2(auVar5,local_fe0);
            local_3e0 = local_e60._0_8_;
            uStack_3d8 = local_e60._8_8_;
            uStack_3d0 = local_e60._16_8_;
            uStack_3c8 = local_e60._24_8_;
            local_400 = local_1000._0_8_;
            lStack_3f8 = local_1000._8_8_;
            lStack_3f0 = local_1000._16_8_;
            lStack_3e8 = local_1000._24_8_;
            local_e60 = vpmaxsw_avx2(local_e60,local_1000);
            alVar3[1] = in_stack_ffffffffffffef00;
            alVar3[0] = in_stack_ffffffffffffeef8;
            alVar3[2]._0_4_ = in_stack_ffffffffffffef08;
            alVar3[2]._4_2_ = uVar24;
            alVar3[2]._6_2_ = uVar25;
            alVar3[3]._0_2_ = uVar33;
            alVar3[3]._2_2_ = uVar26;
            alVar3[3]._4_2_ = uVar27;
            alVar3[3]._6_2_ = uVar28;
            local_6c0 = local_d80;
            auStack_6b0 = auStack_d70;
            arr_store_si256(in_stack_ffffffffffffef20,alVar3,in_stack_ffffffffffffeef4,
                            in_stack_ffffffffffffeef0,
                            (int32_t)((ulong)in_stack_ffffffffffffeee8 >> 0x20),
                            (int32_t)in_stack_ffffffffffffeee8);
            local_cdc = local_cdc + 1;
          }
          local_470 = local_d30 + local_d04;
          auVar21 = *(undefined1 (*) [24])*local_470;
          lStack_408 = (*local_470)[3];
          local_1a0 = local_ea0._0_8_;
          uStack_198 = local_ea0._8_8_;
          uStack_190 = local_ea0._16_8_;
          uStack_188 = local_ea0._24_8_;
          local_1000._0_8_ = auVar21._0_8_;
          local_e0 = local_1000._0_8_;
          local_1000._8_8_ = auVar21._8_8_;
          uStack_d8 = local_1000._8_8_;
          local_1000._16_8_ = auVar21._16_8_;
          uStack_d0 = local_1000._16_8_;
          local_100 = local_e80._0_8_;
          uStack_f8 = local_e80._8_8_;
          uStack_f0 = local_e80._16_8_;
          uStack_e8 = uStack_e68;
          local_1c0 = vpcmpgtw_avx2((undefined1  [32])*local_470,_local_e80);
          auVar5 = vpand_avx2(local_ea0,local_1c0);
          local_420 = local_1000._0_8_;
          uStack_418 = local_1000._8_8_;
          uStack_410 = local_1000._16_8_;
          local_440 = local_e80._0_8_;
          uStack_438 = local_e80._8_8_;
          uStack_430 = local_e80._16_8_;
          uStack_428 = uStack_e68;
          auVar6 = vpmaxsw_avx2((undefined1  [32])*local_470,_local_e80);
          local_10a0 = auVar5._0_8_;
          local_a0 = local_10a0;
          uStack_1098 = auVar5._8_8_;
          uStack_98 = uStack_1098;
          uStack_1090 = auVar5._16_8_;
          uStack_90 = uStack_1090;
          lStack_1088 = auVar5._24_8_;
          lStack_88 = lStack_1088;
          if ((((((((((((((((((((((((((((((((auVar5 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (auVar5 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar5 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar5 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar5 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar5 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar5 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar5 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar5 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar5 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   ) || (auVar5 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                 (auVar5 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar5 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (auVar5 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (auVar5 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             SUB321(auVar5 >> 0x7f,0) != '\0') ||
                            (auVar5 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar5 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar5 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar5 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar5 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar5 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar5 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar5 >> 0xbf,0) != '\0') ||
                    (auVar5 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar5 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar5 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar5 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar5 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar5 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar5 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || lStack_1088 < 0)
          {
            local_cec = local_ce0;
          }
          local_ce0 = local_ce0 + 1;
          auVar4 = _local_e80;
          _local_e80 = auVar6;
          lStack_c8 = lStack_408;
        }
        if (s2_beg != 0) {
          for (local_ce4 = 0; local_ce4 < (int)local_d08; local_ce4 = local_ce4 + 1) {
            auVar5 = vperm2i128_avx2(auVar32._0_32_,_local_e80,0x28);
            auVar32 = ZEXT3264(auVar5);
            _local_e80 = vpalignr_avx2(_local_e80,auVar5,0xe);
          }
          uVar29 = vpextrw_avx(stack0xfffffffffffff190,7);
          local_dc2 = (ushort)uVar29;
          local_ce8 = local_cf0 + -1;
        }
        if (in_stack_00000008 != 0) {
          local_10a8 = local_d30;
          for (local_cdc = 0; local_cdc < local_d00 * local_cfc; local_cdc = local_cdc + 1) {
            iVar30 = local_cdc / local_cfc + (local_cdc % local_cfc) * local_d00;
            if (iVar30 < local_cf0) {
              if ((short)local_dc2 < (short)(*local_10a8)[0]) {
                local_dc2 = (ushort)(*local_10a8)[0];
                local_cec = local_ccc + -1;
                local_ce8 = iVar30;
              }
              else if ((((ushort)(*local_10a8)[0] == local_dc2) && (local_cec == local_ccc + -1)) &&
                      (iVar30 < local_ce8)) {
                local_ce8 = iVar30;
              }
            }
            local_10a8 = (__m256i *)((long)*local_10a8 + 2);
          }
        }
        if ((in_stack_00000008 == 0) && (s2_beg == 0)) {
          local_478 = local_d30 + local_d04;
          local_10e0 = *local_478;
          for (local_ce4 = 0; local_ce4 < (int)local_d08; local_ce4 = local_ce4 + 1) {
            auVar5 = vperm2i128_avx2(auVar32._0_32_,(undefined1  [32])local_10e0,0x28);
            auVar32 = ZEXT3264(auVar5);
            local_10e0 = (__m256i)vpalignr_avx2((undefined1  [32])local_10e0,auVar5,0xe);
          }
          uVar29 = vpextrw_avx(auStack_10d0,7);
          local_dc2 = (ushort)uVar29;
          local_cec = local_ccc + -1;
          local_ce8 = local_cf0 + -1;
        }
        local_120 = local_e00;
        uStack_118 = uStack_df8;
        uStack_110 = uStack_df0;
        uStack_108 = uStack_de8;
        local_140 = local_e40._0_8_;
        uStack_138 = local_e40._8_8_;
        uStack_130 = local_e40._16_8_;
        uStack_128 = local_e40._24_8_;
        auVar20._8_8_ = uStack_df8;
        auVar20._0_8_ = local_e00;
        auVar20._16_8_ = uStack_df0;
        auVar20._24_8_ = uStack_de8;
        local_60 = vpcmpgtw_avx2(auVar20,local_e40);
        local_160 = local_e60._0_8_;
        uStack_158 = local_e60._8_8_;
        uStack_150 = local_e60._16_8_;
        uStack_148 = local_e60._24_8_;
        local_180 = local_e20;
        uStack_178 = uStack_e18;
        uStack_170 = uStack_e10;
        uStack_168 = uStack_e08;
        auVar19._8_8_ = uStack_e18;
        auVar19._0_8_ = local_e20;
        auVar19._16_8_ = uStack_e10;
        auVar19._24_8_ = uStack_e08;
        local_80 = vpcmpgtw_avx2(local_e60,auVar19);
        local_c0 = vpor_avx2(local_60,local_80);
        if ((((((((((((((((((((((((((((((((local_c0 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (local_c0 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_c0 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_c0 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_c0 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_c0 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_c0 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_c0 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_c0 >> 0x47 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_c0 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (local_c0 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                               (local_c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                              || (local_c0 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                              ) || (local_c0 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                            (local_c0 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(local_c0 >> 0x7f,0) != '\0') ||
                          (local_c0 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_c0 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_c0 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_c0 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_c0 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_c0 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (local_c0 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(local_c0 >> 0xbf,0) != '\0') ||
                  (local_c0 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_c0 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_c0 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_c0 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_c0 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (local_c0 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_c0 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            local_c0[0x1f] < '\0') {
          local_ee8->flag = local_ee8->flag | 0x40;
          local_dc2 = 0;
          local_ce8 = 0;
          local_cec = 0;
        }
        local_ee8->score = (int)(short)local_dc2;
        local_ee8->end_query = local_ce8;
        local_ee8->end_ref = local_cec;
        parasail_free(local_d38);
        parasail_free(local_d30);
        parasail_free(local_d28);
        parasail_free(local_d20);
        parasail_free(local_d18);
        local_cb8 = local_ee8;
      }
    }
  }
  return local_cb8;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi16(_mm256_set1_epi16(position),
            _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int16_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_16_t h;
            __m256i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        vHp = _mm256_insert_epi16_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vE, vGapE),
                    _mm256_subs_epi16(vH, vGapO));
            vHp = _mm256_adds_epi16(vHp, vW);
            vF = _mm256_max_epi16(vF, _mm256_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm256_max_epi16(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vHt = _mm256_insert_epi16_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi16(vF, _mm256_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            vF = _mm256_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        vH = _mm256_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vF, vGapE),
                    _mm256_subs_epi16(vH, vGapO));
            vH = _mm256_max_epi16(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m256i vCompare;
            vH = _mm256_load_si256(pvH + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm256_max_epi16(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 2);
        }
        score = (int16_t) _mm256_extract_epi16_rpl(vMaxH, 15);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            score = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}